

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O2

void __thiscall TriangleFacet::TriangleFacet(TriangleFacet *this,int i0,int i1,int i2)

{
  this->tet = (Tetrahedron *)0x0;
  (this->sNodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->sNodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->sNodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->orderedNodeIndices)._M_elems[0] = i0;
  (this->orderedNodeIndices)._M_elems[1] = i1;
  (this->orderedNodeIndices)._M_elems[2] = i2;
  std::__sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(&this->orderedNodeIndices,&this->sNodes);
  return;
}

Assistant:

TriangleFacet(int i0, int i1, int i2){
        orderedNodeIndices[0] = i0;
        orderedNodeIndices[1] = i1;
        orderedNodeIndices[2] = i2;
        std::sort(orderedNodeIndices.begin(), orderedNodeIndices.end());
    }